

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O0

int __thiscall smf::Binasc::outputStyleMidi(Binasc *this,ostream *out,istream *input)

{
  istream *piVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  void *pvVar5;
  string local_210 [36];
  int local_1ec;
  int local_1e8;
  int command;
  int trackbytes;
  int tracksize;
  int i;
  int divisions;
  uchar byte2;
  uint uStack_1d0;
  uchar byte1;
  int trackcount;
  int filetype;
  int headersize;
  stringstream local_1b8 [8];
  stringstream tempout;
  ostream local_1a8 [383];
  byte local_29;
  istream *piStack_28;
  uchar ch;
  istream *input_local;
  ostream *out_local;
  Binasc *this_local;
  
  piStack_28 = input;
  input_local = (istream *)out;
  out_local = (ostream *)this;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::istream::read((char *)piStack_28,(long)&local_29);
  bVar2 = std::ios::eof();
  if ((bVar2 & 1) == 0) {
    if (local_29 == 0x4d) {
      std::istream::read((char *)piStack_28,(long)&local_29);
      if (local_29 == 0x54) {
        std::istream::read((char *)piStack_28,(long)&local_29);
        if (local_29 == 0x68) {
          std::istream::read((char *)piStack_28,(long)&local_29);
          if (local_29 == 100) {
            std::operator<<(local_1a8,"\"MThd\"");
            if (this->m_commentsQ != 0) {
              std::operator<<(local_1a8,"\t\t\t; MIDI header chunk marker");
            }
            std::ostream::operator<<(local_1a8,std::endl<char,std::char_traits<char>>);
            trackcount = 0;
            std::istream::read((char *)piStack_28,(long)&local_29);
            trackcount = trackcount << 8 | (uint)local_29;
            std::istream::read((char *)piStack_28,(long)&local_29);
            trackcount = trackcount << 8 | (uint)local_29;
            std::istream::read((char *)piStack_28,(long)&local_29);
            trackcount = trackcount << 8 | (uint)local_29;
            std::istream::read((char *)piStack_28,(long)&local_29);
            trackcount = trackcount << 8 | (uint)local_29;
            poVar4 = std::operator<<(local_1a8,"4\'");
            std::ostream::operator<<(poVar4,trackcount);
            if (this->m_commentsQ != 0) {
              std::operator<<(local_1a8,"\t\t\t; bytes to follow in header chunk");
            }
            std::ostream::operator<<(local_1a8,std::endl<char,std::char_traits<char>>);
            uStack_1d0 = 0;
            std::istream::read((char *)piStack_28,(long)&local_29);
            uStack_1d0 = uStack_1d0 << 8 | (uint)local_29;
            std::istream::read((char *)piStack_28,(long)&local_29);
            uStack_1d0 = uStack_1d0 << 8 | (uint)local_29;
            poVar4 = std::operator<<(local_1a8,"2\'");
            std::ostream::operator<<(poVar4,uStack_1d0);
            if (this->m_commentsQ != 0) {
              poVar4 = std::operator<<(local_1a8,"\t\t\t; file format: Type-");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,uStack_1d0);
              std::operator<<(poVar4," (");
              if (uStack_1d0 == 0) {
                std::operator<<(local_1a8,"single track");
              }
              else if (uStack_1d0 == 1) {
                std::operator<<(local_1a8,"multitrack");
              }
              else if (uStack_1d0 == 2) {
                std::operator<<(local_1a8,"multisegment");
              }
              else {
                std::operator<<(local_1a8,"unknown");
              }
              std::operator<<(local_1a8,")");
            }
            std::ostream::operator<<(local_1a8,std::endl<char,std::char_traits<char>>);
            divisions = 0;
            std::istream::read((char *)piStack_28,(long)&local_29);
            divisions = divisions << 8 | (uint)local_29;
            std::istream::read((char *)piStack_28,(long)&local_29);
            divisions = divisions << 8 | (uint)local_29;
            poVar4 = std::operator<<(local_1a8,"2\'");
            std::ostream::operator<<(poVar4,divisions);
            if (this->m_commentsQ != 0) {
              std::operator<<(local_1a8,"\t\t\t; number of tracks");
            }
            std::ostream::operator<<(local_1a8,std::endl<char,std::char_traits<char>>);
            std::istream::read((char *)piStack_28,(long)&i + 3);
            std::istream::read((char *)piStack_28,(long)&i + 2);
            if ((i._3_1_ & 0x80) == 0) {
              tracksize = (int)CONCAT11(i._3_1_,i._2_1_);
              poVar4 = std::operator<<(local_1a8,"2\'");
              std::ostream::operator<<(poVar4,tracksize);
              if (this->m_commentsQ != 0) {
                std::operator<<(local_1a8,"\t\t\t; ticks per quarter note");
              }
              std::ostream::operator<<(local_1a8,std::endl<char,std::char_traits<char>>);
            }
            else {
              poVar4 = std::operator<<(local_1a8,"\'-");
              std::ostream::operator<<(poVar4,0x100 - (ulong)i._3_1_);
              if (this->m_commentsQ != 0) {
                std::operator<<(local_1a8,"\t\t\t; SMPTE frames/second");
              }
              std::ostream::operator<<(local_1a8,std::endl<char,std::char_traits<char>>);
              poVar4 = std::operator<<(local_1a8,"\'");
              pvVar5 = (void *)std::ostream::operator<<(poVar4,std::dec);
              std::ostream::operator<<(pvVar5,(ulong)i._2_1_);
              if (this->m_commentsQ != 0) {
                std::operator<<(local_1a8,"\t\t\t; subframes per frame");
              }
              std::ostream::operator<<(local_1a8,std::endl<char,std::char_traits<char>>);
            }
            for (trackbytes = 0; trackbytes < trackcount + -6; trackbytes = trackbytes + 1) {
              std::istream::read((char *)piStack_28,(long)&local_29);
              if (local_29 < 0x10) {
                std::operator<<(local_1a8,'0');
              }
              pvVar5 = (void *)std::ostream::operator<<(local_1a8,std::hex);
              std::ostream::operator<<(pvVar5,(uint)local_29);
            }
            if (0 < trackcount + -6) {
              std::operator<<(local_1a8,"\t\t\t; unknown header bytes");
              std::ostream::operator<<(local_1a8,std::endl<char,std::char_traits<char>>);
            }
            for (trackbytes = 0; piVar1 = input_local, trackbytes < divisions;
                trackbytes = trackbytes + 1) {
              poVar4 = std::operator<<(local_1a8,"\n;;; TRACK ");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,trackbytes);
              poVar4 = std::operator<<(poVar4," ----------------------------------");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              std::istream::read((char *)piStack_28,(long)&local_29);
              if (local_29 != 0x4d) {
                poVar4 = std::operator<<((ostream *)&std::cerr,"Not a MIDI file M2");
                std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                this_local._4_4_ = 0;
                goto LAB_0012d535;
              }
              std::istream::read((char *)piStack_28,(long)&local_29);
              if (local_29 != 0x54) {
                poVar4 = std::operator<<((ostream *)&std::cerr,"Not a MIDI file T2");
                std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                this_local._4_4_ = 0;
                goto LAB_0012d535;
              }
              std::istream::read((char *)piStack_28,(long)&local_29);
              if (local_29 != 0x72) {
                poVar4 = std::operator<<((ostream *)&std::cerr,"Not a MIDI file r");
                std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                this_local._4_4_ = 0;
                goto LAB_0012d535;
              }
              std::istream::read((char *)piStack_28,(long)&local_29);
              if (local_29 != 0x6b) {
                poVar4 = std::operator<<((ostream *)&std::cerr,"Not a MIDI file k");
                std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                this_local._4_4_ = 0;
                goto LAB_0012d535;
              }
              std::operator<<(local_1a8,"\"MTrk\"");
              if (this->m_commentsQ != 0) {
                std::operator<<(local_1a8,"\t\t\t; MIDI track chunk marker");
              }
              std::ostream::operator<<(local_1a8,std::endl<char,std::char_traits<char>>);
              command = 0;
              std::istream::read((char *)piStack_28,(long)&local_29);
              command = command << 8 | (uint)local_29;
              std::istream::read((char *)piStack_28,(long)&local_29);
              command = command << 8 | (uint)local_29;
              std::istream::read((char *)piStack_28,(long)&local_29);
              command = command << 8 | (uint)local_29;
              std::istream::read((char *)piStack_28,(long)&local_29);
              command = command << 8 | (uint)local_29;
              poVar4 = std::operator<<(local_1a8,"4\'");
              std::ostream::operator<<(poVar4,command);
              if (this->m_commentsQ != 0) {
                std::operator<<(local_1a8,"\t\t\t; bytes to follow in track chunk");
              }
              std::ostream::operator<<(local_1a8,std::endl<char,std::char_traits<char>>);
              local_1e8 = 0;
              local_1ec = 0;
              while( true ) {
                iVar3 = readMidiEvent(this,local_1a8,piStack_28,&local_1e8,&local_1ec);
                if (iVar3 == 0) break;
                std::operator<<(local_1a8,"\n");
              }
              std::operator<<(local_1a8,"\n");
              if (local_1e8 != command) {
                poVar4 = std::operator<<(local_1a8,"; TRACK SIZE ERROR, ACTUAL SIZE: ");
                pvVar5 = (void *)std::ostream::operator<<(poVar4,local_1e8);
                std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
              }
            }
            std::__cxx11::stringstream::str();
            std::operator<<((ostream *)piVar1,local_210);
            std::__cxx11::string::~string(local_210);
            this_local._4_4_ = 1;
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Not a MIDI file d");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            this_local._4_4_ = 0;
          }
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Not a MIDI file h");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          this_local._4_4_ = 0;
        }
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Not a MIDI file T");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        this_local._4_4_ = 0;
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Not a MIDI file M");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      this_local._4_4_ = 0;
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"End of the file right away!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = 0;
  }
LAB_0012d535:
  filetype = 1;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return this_local._4_4_;
}

Assistant:

int Binasc::outputStyleMidi(std::ostream& out, std::istream& input) {
	uchar ch;                      // current input byte
	std::stringstream tempout;
	input.read((char*)&ch, 1);

	if (input.eof()) {
		std::cerr << "End of the file right away!" << std::endl;
		return 0;
	}

	// Read the MIDI file header:

	// The first four bytes must be the characters "MThd"
	if (ch != 'M') { std::cerr << "Not a MIDI file M" << std::endl; return 0; }
	input.read((char*)&ch, 1);
	if (ch != 'T') { std::cerr << "Not a MIDI file T" << std::endl; return 0; }
	input.read((char*)&ch, 1);
	if (ch != 'h') { std::cerr << "Not a MIDI file h" << std::endl; return 0; }
	input.read((char*)&ch, 1);
	if (ch != 'd') { std::cerr << "Not a MIDI file d" << std::endl; return 0; }
	tempout << "\"MThd\"";
	if (m_commentsQ) {
		tempout << "\t\t\t; MIDI header chunk marker";
	}
	tempout << std::endl;

	// The next four bytes are a big-endian byte count for the header
	// which should nearly always be "6".
	int headersize = 0;
	input.read((char*)&ch, 1); headersize = (headersize << 8) | ch;
	input.read((char*)&ch, 1); headersize = (headersize << 8) | ch;
	input.read((char*)&ch, 1); headersize = (headersize << 8) | ch;
	input.read((char*)&ch, 1); headersize = (headersize << 8) | ch;
	tempout << "4'" << headersize;
	if (m_commentsQ) {
		tempout << "\t\t\t; bytes to follow in header chunk";
	}
	tempout << std::endl;

	// First number in header is two-byte file type.
	int filetype = 0;
	input.read((char*)&ch, 1);
	filetype = (filetype << 8) | ch;
	input.read((char*)&ch, 1);
	filetype = (filetype << 8) | ch;
	tempout << "2'" << filetype;
	if (m_commentsQ) {
		tempout << "\t\t\t; file format: Type-" << filetype << " (";
		switch (filetype) {
			case 0:  tempout << "single track"; break;
			case 1:  tempout << "multitrack";   break;
			case 2:  tempout << "multisegment"; break;
			default: tempout << "unknown";      break;
		}
		tempout << ")";
	}
	tempout << std::endl;

	// Second number in header is two-byte trackcount.
	int trackcount = 0;
	input.read((char*)&ch, 1);
	trackcount = (trackcount << 8) | ch;
	input.read((char*)&ch, 1);
	trackcount = (trackcount << 8) | ch;
	tempout << "2'" << trackcount;
	if (m_commentsQ) {
		tempout << "\t\t\t; number of tracks";
	}
	tempout << std::endl;

	// Third number is divisions.  This can be one of two types:
	// regular: top bit is 0: number of ticks per quarter note
	// SMPTE:   top bit is 1: first byte is negative frames, second is
	//          ticks per frame.
	uchar byte1;
	uchar byte2;
	input.read((char*)&byte1, 1);
	input.read((char*)&byte2, 1);
	if (byte1 & 0x80) {
		// SMPTE divisions
		tempout << "'-" << 0xff - (ulong)byte1 + 1;
		if (m_commentsQ) {
			tempout << "\t\t\t; SMPTE frames/second";
		}
		tempout << std::endl;
		tempout << "'" << std::dec << (long)byte2;
		if (m_commentsQ) {
			tempout << "\t\t\t; subframes per frame";
		}
		tempout << std::endl;
	} else {
		// regular divisions
		int divisions = 0;
		divisions = (divisions << 8) | byte1;
		divisions = (divisions << 8) | byte2;
		tempout << "2'" << divisions;
		if (m_commentsQ) {
			tempout << "\t\t\t; ticks per quarter note";
		}
		tempout << std::endl;
	}

	// Print any strange bytes in header:
	int i;
	for (i=0; i<headersize - 6; i++) {
		input.read((char*)&ch, 1);
		if (ch < 0x10) {
			tempout << '0';
		}
		tempout << std::hex << (int)ch;
	}
	if (headersize - 6 > 0) {
		tempout << "\t\t\t; unknown header bytes";
		tempout << std::endl;
	}

	for (i=0; i<trackcount; i++) {
		tempout << "\n;;; TRACK "
				  << i << " ----------------------------------" << std::endl;

		input.read((char*)&ch, 1);
		// The first four bytes of a track must be the characters "MTrk"
		if (ch != 'M') { std::cerr << "Not a MIDI file M2" << std::endl; return 0; }
		input.read((char*)&ch, 1);
		if (ch != 'T') { std::cerr << "Not a MIDI file T2" << std::endl; return 0; }
		input.read((char*)&ch, 1);
		if (ch != 'r') { std::cerr << "Not a MIDI file r" << std::endl; return 0; }
		input.read((char*)&ch, 1);
		if (ch != 'k') { std::cerr << "Not a MIDI file k" << std::endl; return 0; }
		tempout << "\"MTrk\"";
		if (m_commentsQ) {
			tempout << "\t\t\t; MIDI track chunk marker";
		}
		tempout << std::endl;

		// The next four bytes are a big-endian byte count for the track
		int tracksize = 0;
		input.read((char*)&ch, 1); tracksize = (tracksize << 8) | ch;
		input.read((char*)&ch, 1); tracksize = (tracksize << 8) | ch;
		input.read((char*)&ch, 1); tracksize = (tracksize << 8) | ch;
		input.read((char*)&ch, 1); tracksize = (tracksize << 8) | ch;
		tempout << "4'" << tracksize;
		if (m_commentsQ) {
			tempout << "\t\t\t; bytes to follow in track chunk";
		}
		tempout << std::endl;

		int trackbytes = 0;
		int command = 0;

		// process MIDI events until the end of the track
		while (readMidiEvent(tempout, input, trackbytes, command)) {
			tempout << "\n";
		};
		tempout << "\n";

		if (trackbytes != tracksize) {
			tempout << "; TRACK SIZE ERROR, ACTUAL SIZE: " << trackbytes << std::endl;
		}
	}

	// print #define definitions if requested.


	// print main content of MIDI file parsing:
	out << tempout.str();
	return 1;
}